

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

void absl::lts_20240722::cord_internal::CordzInfo::TrackCord
               (InlineData *cord,InlineData *src,MethodIdentifier method)

{
  CordRep *rep;
  CordzInfo *pCVar1;
  CordzInfo *src_00;
  CordzInfo *pCVar2;
  
  if (((cord->rep_).field_0.data[0] & 1U) == 0) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0x108,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, const InlineData &, MethodIdentifier)"
                 );
  }
  if (((src->rep_).field_0.data[0] & 1U) != 0) {
    pCVar1 = InlineData::cordz_info(cord);
    if (pCVar1 != (CordzInfo *)0x0) {
      Untrack(pCVar1);
    }
    pCVar1 = (CordzInfo *)operator_new(0x540);
    if (((cord->rep_).field_0.data[0] & 1U) != 0) {
      rep = (cord->rep_).field_0.as_tree.rep;
      src_00 = InlineData::cordz_info(src);
      pCVar2 = InlineData::cordz_info(src);
      CordzInfo(pCVar1,rep,src_00,method,pCVar2->sampling_stride_);
      if (((cord->rep_).field_0.data[0] & 1U) != 0) {
        (cord->rep_).field_0.as_tree.cordz_info = (ulong)pCVar1 | 1;
        Track(pCVar1);
        return;
      }
      __assert_fail("is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x24b,"void absl::cord_internal::InlineData::set_cordz_info(CordzInfo *)");
    }
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x272,"CordRep *absl::cord_internal::InlineData::as_tree() const");
  }
  __assert_fail("src.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0x109,
                "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, const InlineData &, MethodIdentifier)"
               );
}

Assistant:

void CordzInfo::TrackCord(InlineData& cord, const InlineData& src,
                          MethodIdentifier method) {
  assert(cord.is_tree());
  assert(src.is_tree());

  // Unsample current as we the current cord is being replaced with 'src',
  // so any method history is no longer relevant.
  CordzInfo* cordz_info = cord.cordz_info();
  if (cordz_info != nullptr) cordz_info->Untrack();

  // Start new cord sample
  cordz_info = new CordzInfo(cord.as_tree(), src.cordz_info(), method,
                             src.cordz_info()->sampling_stride());
  cord.set_cordz_info(cordz_info);
  cordz_info->Track();
}